

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_transaction_FundRawTransaction_Check2_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_Check2_Test *this)

{
  pointer pCVar1;
  AssertHelper fund_handle_00;
  void *handle_00;
  bool bVar2;
  int iVar3;
  allocator_type *in_RCX;
  size_type extraout_RDX;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  CfdTestFundElementsUtxoVector *test_data;
  pointer pCVar6;
  initializer_list<CfdTestFundElementsUtxoVector> __l;
  int64_t tx_fee_amount;
  int ret;
  char *output_tx_hex;
  void *fund_handle;
  AssertionResult gtest_ar_;
  void *handle;
  uint32_t append_txout_count;
  AssertionResult gtest_ar;
  AssertHelper local_178;
  int local_16c;
  AssertHelper local_168;
  AssertHelper local_160;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  AssertHelper local_150;
  string local_148;
  void *local_128;
  AssertHelper local_120;
  uint32_t local_114;
  string local_110;
  undefined4 local_f0;
  undefined8 local_e8;
  string local_e0;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined4 local_80;
  undefined8 local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (TestBody()::exp_dummy_asset_a == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::exp_dummy_asset_a);
    if (iVar3 != 0) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225","");
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&TestBody::exp_dummy_asset_a,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      __cxa_atexit(cfd::core::ConfidentialAssetId::~ConfidentialAssetId,&TestBody::exp_dummy_asset_a
                   ,&__dso_handle);
      __cxa_guard_release(&TestBody()::exp_dummy_asset_a);
    }
  }
  if (TestBody()::kFundCoinSelectElementsTestVector3 == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3);
    if (iVar3 != 0) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "2bc630021e76ab6bd7f8da54b0c59381e0265b093629e4384207030adba99775","");
      local_f0 = 0;
      local_e8 = 150000000;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_e0,&TestBody::exp_dummy_asset_a);
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,
                 "sh(wpkh([b8f7f84b/0\'/0\'/4\']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5"
                 ,"");
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,
                 "42120c9e8adc1d0f0d843617a0c91d699a1eb67fb744dde21103d6423fa5c8c5","");
      local_80 = 1;
      local_78 = 150000000;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_70,&TestBody::exp_dummy_asset_a);
      local_50[0] = local_40;
      pcVar5 = 
      "sh(wpkh([b8f7f84b/0\'/0\'/4\']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5"
      ;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,
                 "sh(wpkh([b8f7f84b/0\'/0\'/4\']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5"
                 ,"");
      __l._M_len = extraout_RDX;
      __l._M_array = (iterator)pcVar5;
      std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>::
      vector((vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
              *)&local_110,__l,in_RCX);
      lVar4 = 0x70;
      do {
        TestBody::CfdTestFundElementsUtxoVector::~CfdTestFundElementsUtxoVector
                  ((CfdTestFundElementsUtxoVector *)((long)&local_110._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x70;
      } while (lVar4 != -0x70);
      __cxa_atexit(std::
                   vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
                   ::~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
      __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
    }
  }
  if (TestBody()::kExpTxData_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_);
    if (iVar3 != 0) {
      TestBody()::kExpTxData_abi_cxx11_._M_dataplus._M_p =
           (pointer)&TestBody()::kExpTxData_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&TestBody()::kExpTxData_abi_cxx11_,
                 "0200000000027597a9db0a03074238e42936095b26e08193c5b054daf8d76bab761e0230c62b0000000000ffffffffc5c8a53f42d60311e2dd44b77fb61e9a691dc9a01736840d0f1ddc8a9e0c12420100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007be00000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000bebba420230646d493a7ed8cb0091ad6e8feedcc9cd17a9162e61b7cff7929697792ef64217a91497dfc3937ad66e142925a76489eebc75358bca338700000000"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
    }
  }
  CfdInitialize();
  local_128 = (void *)0x0;
  local_16c = CfdCreateHandle(&local_128);
  local_148._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_110,"kCfdSuccess","ret",(CfdErrorCode *)&local_148,&local_16c);
  if ((char)local_110._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_148);
    if ((undefined8 *)local_110._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_110._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x77a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_148._M_dataplus._M_p._4_4_,
                                       local_148._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_148._M_dataplus._M_p._0_4_ =
       CONCAT31(local_148._M_dataplus._M_p._1_3_,local_128 != (void *)0x0);
  local_148._M_string_length = 0;
  if (local_128 == (void *)0x0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_148,(AssertionResult *)"(NULL == handle)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x77b,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_150.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_150.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_150.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_110,&TestBody::exp_dummy_asset_a);
  local_150.data_ = (AssertHelperData *)0x0;
  local_16c = CfdInitializeFundRawTx(local_128,0xb,1,local_110._M_dataplus._M_p,&local_150.data_);
  local_178.data_ = (AssertHelperData *)((ulong)local_178.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_148,"kCfdSuccess","ret",(CfdErrorCode *)&local_178,&local_16c);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_178);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x785,pcVar5);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((internal *)&local_148,"nullptr","fund_handle",&local_178.data_,&local_150.data_);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_178);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x786,pcVar5);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar1 = TestBody::kFundCoinSelectElementsTestVector3.
           super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_16c == 0) {
    if (TestBody::kFundCoinSelectElementsTestVector3.
        super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        TestBody::kFundCoinSelectElementsTestVector3.
        super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar6 = TestBody::kFundCoinSelectElementsTestVector3.
               super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_16c = CfdAddUtxoForFundRawTx
                              (local_128,local_150.data_,(pCVar6->txid)._M_dataplus._M_p,
                               pCVar6->vout,pCVar6->amount,(pCVar6->descriptor)._M_dataplus._M_p,
                               (pCVar6->asset)._M_dataplus._M_p);
        local_178.data_ = local_178.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_148,"kCfdSuccess","ret",(CfdErrorCode *)&local_178,&local_16c)
        ;
        if ((char)local_148._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_178);
          pcVar5 = "";
          if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
            pcVar5 = *(char **)local_148._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x78f,pcVar5);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if (local_178.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_178.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_148._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pCVar6 = pCVar6 + 1;
      } while (pCVar6 != pCVar1);
    }
    handle_00 = local_128;
    fund_handle_00.data_ = local_150.data_;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_148,&TestBody::exp_dummy_asset_a);
    local_16c = CfdAddTargetAmountForFundRawTx
                          (handle_00,fund_handle_00.data_,0,100000000,
                           (char *)CONCAT44(local_148._M_dataplus._M_p._4_4_,
                                            local_148._M_dataplus._M_p._0_4_),
                           "AzpkHG7iBPzGn3wCoKwEUrNMWA8TCLXTvhK6ftgAmaAGWqDKyDipYSFjsBBcGXKj3Y65Kt9UauCEbftj"
                          );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
        &local_148.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_));
    }
    local_178.data_ = local_178.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_148,"kCfdSuccess","ret",(CfdErrorCode *)&local_178,&local_16c);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_178);
      if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x795,pcVar5);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      if (local_178.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_178.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_148._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_16c = CfdSetOptionFundRawTx(local_128,local_150.data_,1,0,0.0,true);
    local_178.data_ = local_178.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_148,"kCfdSuccess","ret",(CfdErrorCode *)&local_178,&local_16c);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_178);
      if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x799,pcVar5);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      if (local_178.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_178.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_148._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_16c = CfdSetOptionFundRawTx(local_128,local_150.data_,1,0,0.0,true);
    local_178.data_ = local_178.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_148,"kCfdSuccess","ret",(CfdErrorCode *)&local_178,&local_16c);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_178);
      if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x79c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      if (local_178.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_178.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_148._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_178.data_ = (AssertHelperData *)0x0;
    local_114 = 0;
    local_168.data_ = (AssertHelperData *)0x0;
    local_16c = CfdFinalizeFundRawTx
                          (local_128,local_150.data_,
                           "020000000000010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe8700000000"
                           ,1.0,(int64_t *)&local_178,&local_114,(char **)&local_168);
    local_158.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_158.ptr_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_148,"kCfdSuccess","ret",(CfdErrorCode *)&local_158,&local_16c);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_158);
      if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x7a5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      if (local_158.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_158.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_158.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_148._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_16c == 0) {
      local_158.ptr_._0_4_ = 0x7be;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&local_148,"1982","tx_fee_amount",(int *)&local_158,(long *)&local_178)
      ;
      if ((char)local_148._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_158);
        if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_148._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7a7,pcVar5);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        if (local_158.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_158.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_158.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_148._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_158.ptr_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_148,"1","append_txout_count",(int *)&local_158,&local_114);
      if ((char)local_148._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_158);
        if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_148._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7a9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        if (local_158.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_158.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_158.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_148._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_148,"kExpTxData.c_str()","output_tx_hex",
                 TestBody()::kExpTxData_abi_cxx11_._M_dataplus._M_p,(char *)local_168.data_);
      if ((char)local_148._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_158);
        if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_148._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7aa,pcVar5);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        if (local_158.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_158.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_158.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_148._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_168.data_);
    }
    else {
      local_16c = CfdGetLastErrorCode(local_128);
      if (local_16c != 0) {
        local_158.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_16c = CfdGetLastErrorMessage(local_128,(char **)&local_158);
        local_160.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_148,"kCfdSuccess","ret",(CfdErrorCode *)&local_160,&local_16c)
        ;
        if ((char)local_148._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_160);
          if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = *(char **)local_148._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x7b1,pcVar5);
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          if (CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_148._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pcVar5 = "";
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_148,"\"\"","str_buffer","",(char *)local_158.ptr_);
        if ((char)local_148._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_160);
          if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
            pcVar5 = *(char **)local_148._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x7b2,pcVar5);
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          if (CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_148._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CfdFreeStringBuffer((char *)local_158.ptr_);
      }
    }
  }
  local_16c = CfdFreeFundRawTxHandle(local_128,local_150.data_);
  local_178.data_ = local_178.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_148,"kCfdSuccess","ret",(CfdErrorCode *)&local_178,&local_16c);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_178);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x7b9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (local_178.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_178.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_178.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_16c = CfdFreeHandle(local_128);
  local_148._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_110,"kCfdSuccess","ret",(CfdErrorCode *)&local_148,&local_16c);
  if ((char)local_110._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_148);
    if ((undefined8 *)local_110._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_110._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x7c1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_148._M_dataplus._M_p._4_4_,
                                       local_148._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_Check2) {
  // from cfd-go
  struct CfdTestFundElementsUtxoVector {
    std::string txid;
    uint32_t vout;
    int64_t amount;
    std::string asset;
    std::string descriptor;
  };
  static ConfidentialAssetId exp_dummy_asset_a("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  static const std::vector<CfdTestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    {
      "2bc630021e76ab6bd7f8da54b0c59381e0265b093629e4384207030adba99775",
      0,
      150000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh([b8f7f84b/0'/0'/4']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5",
    },
    {
      "42120c9e8adc1d0f0d843617a0c91d699a1eb67fb744dde21103d6423fa5c8c5",
      1,
      150000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh([b8f7f84b/0'/0'/4']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5",
    },
  };
  static const std::string kExpTxData = "0200000000027597a9db0a03074238e42936095b26e08193c5b054daf8d76bab761e0230c62b0000000000ffffffffc5c8a53f42d60311e2dd44b77fb61e9a691dc9a01736840d0f1ddc8a9e0c12420100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007be00000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000bebba420230646d493a7ed8cb0091ad6e8feedcc9cd17a9162e61b7cff7929697792ef64217a91497dfc3937ad66e142925a76489eebc75358bca338700000000";
  // static const std::string kExpTxData = "0200000000027597a9db0a03074238e42936095b26e08193c5b054daf8d76bab761e0230c62b0000000000ffffffffc5c8a53f42d60311e2dd44b77fb61e9a691dc9a01736840d0f1ddc8a9e0c12420100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007ae00000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000bebba520230646d493a7ed8cb0091ad6e8feedcc9cd17a9162e61b7cff7929697792ef64217a91497dfc3937ad66e142925a76489eebc75358bca338700000000";

  CfdInitialize();
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  try {
    const char* tx = "020000000000010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe8700000000";
    uint32_t target_asset_count = 1;
    auto fee_asset = exp_dummy_asset_a.GetHex();
    void* fund_handle = nullptr;
    ret = CfdInitializeFundRawTx(
        handle, kCfdNetworkElementsRegtest, target_asset_count,
        fee_asset.c_str(), &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_NE(nullptr, fund_handle);
    if (ret == kCfdSuccess) {
      for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
        ret = CfdAddUtxoForFundRawTx(
            handle, fund_handle,
            test_data.txid.c_str(), test_data.vout,
            test_data.amount,
            test_data.descriptor.c_str(),
            test_data.asset.c_str());
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0, 100000000,
          exp_dummy_asset_a.GetHex().c_str(),
          "AzpkHG7iBPzGn3wCoKwEUrNMWA8TCLXTvhK6ftgAmaAGWqDKyDipYSFjsBBcGXKj3Y65Kt9UauCEbftj");
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
          0, 0, true);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
          0, 0, true);
      EXPECT_EQ(kCfdSuccess, ret);

      int64_t tx_fee_amount = 0;
      uint32_t append_txout_count = 0;
      char* output_tx_hex = nullptr;
      double effective_fee_rate = 1.0;
      ret = CfdFinalizeFundRawTx(handle, fund_handle, tx,
          effective_fee_rate, &tx_fee_amount, &append_txout_count,
          &output_tx_hex);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_EQ(1982, tx_fee_amount);
        // EXPECT_EQ(1966, tx_fee_amount);
        EXPECT_EQ(1, append_txout_count);
        EXPECT_STREQ(kExpTxData.c_str(), output_tx_hex);
        CfdFreeStringBuffer(output_tx_hex);
      } else {
        ret = CfdGetLastErrorCode(handle);
        if (ret != kCfdSuccess) {
          char* str_buffer = NULL;
          ret = CfdGetLastErrorMessage(handle, &str_buffer);
          EXPECT_EQ(kCfdSuccess, ret);
          EXPECT_STREQ("", str_buffer);
          CfdFreeStringBuffer(str_buffer);
          str_buffer = NULL;
        }
      }
    }
    ret = CfdFreeFundRawTxHandle(handle, fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);

    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}